

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsGetMetaDataTypeFromName(char *name,FmsMetaDataType *type)

{
  int iVar1;
  FmsMetaDataType FVar2;
  
  if (name == (char *)0x0) {
    return 1;
  }
  if (type == (FmsMetaDataType *)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = strcmp("FMS_INTEGER",name);
    FVar2 = FMS_INTEGER;
    if (iVar1 != 0) {
      iVar1 = strcmp("FMS_SCALAR",name);
      if (iVar1 == 0) {
        FVar2 = FMS_SCALAR;
      }
      else {
        iVar1 = strcmp("FMS_STRING",name);
        if (iVar1 == 0) {
          FVar2 = FMS_STRING;
        }
        else {
          iVar1 = strcmp("FMS_META_DATA",name);
          FVar2 = FMS_META_DATA;
          if (iVar1 != 0) {
            return 3;
          }
        }
      }
    }
    *type = FVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int FmsGetMetaDataTypeFromName(const char * const name, FmsMetaDataType *type) {
  if(!name) E_RETURN(1);
  if(!type) E_RETURN(2);

  if(strcmp(FmsMetaDataTypeNames[FMS_INTEGER], name) == 0)
    *type = FMS_INTEGER;
  else if(strcmp(FmsMetaDataTypeNames[FMS_SCALAR], name) == 0)
    *type = FMS_SCALAR;
  else if(strcmp(FmsMetaDataTypeNames[FMS_STRING], name) == 0)
    *type = FMS_STRING;
  else if(strcmp(FmsMetaDataTypeNames[FMS_META_DATA], name) == 0)
    *type = FMS_META_DATA;
  else
    E_RETURN(3);

  return 0;
}